

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_test.cc
# Opt level: O0

void __thiscall
pickrst_test_highbd::PixelProjHighbdErrorTest::~PixelProjHighbdErrorTest
          (PixelProjHighbdErrorTest *this)

{
  PixelProjHighbdErrorTest *unaff_retaddr;
  
  ~PixelProjHighbdErrorTest(unaff_retaddr);
  return;
}

Assistant:

void SetUp() override {
    target_func_ = GET_PARAM(0);
    src_ =
        (uint16_t *)aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*src_));
    ASSERT_NE(src_, nullptr);
    dgd_ =
        (uint16_t *)aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*dgd_));
    ASSERT_NE(dgd_, nullptr);
    flt0_ =
        (int32_t *)aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*flt0_));
    ASSERT_NE(flt0_, nullptr);
    flt1_ =
        (int32_t *)aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK * sizeof(*flt1_));
    ASSERT_NE(flt1_, nullptr);
  }